

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

int sam_open_mode(char *mode,char *fn,char *format)

{
  int iVar1;
  char *pcVar2;
  char *local_38;
  char *ext;
  char *format_local;
  char *fn_local;
  char *mode_local;
  
  if (format == (char *)0x0) {
    if (fn == (char *)0x0) {
      local_38 = (char *)0x0;
    }
    else {
      local_38 = strrchr(fn,0x2e);
    }
    if ((local_38 == (char *)0x0) || (pcVar2 = strchr(local_38,0x2f), pcVar2 != (char *)0x0)) {
      mode_local._4_4_ = -1;
    }
    else {
      mode_local._4_4_ = sam_open_mode(mode,fn,local_38 + 1);
    }
  }
  else {
    iVar1 = strcmp(format,"bam");
    if (iVar1 == 0) {
      strcpy(mode,"b");
    }
    else {
      iVar1 = strcmp(format,"cram");
      if (iVar1 == 0) {
        strcpy(mode,"c");
      }
      else {
        iVar1 = strcmp(format,"sam");
        if (iVar1 != 0) {
          return -1;
        }
        strcpy(mode,"");
      }
    }
    mode_local._4_4_ = 0;
  }
  return mode_local._4_4_;
}

Assistant:

int sam_open_mode(char *mode, const char *fn, const char *format)
{
    // TODO Parse "bam5" etc for compression level
    if (format == NULL) {
        // Try to pick a format based on the filename extension
        const char *ext = fn? strrchr(fn, '.') : NULL;
        if (ext == NULL || strchr(ext, '/')) return -1;
        return sam_open_mode(mode, fn, ext+1);
    }
    else if (strcmp(format, "bam") == 0) strcpy(mode, "b");
    else if (strcmp(format, "cram") == 0) strcpy(mode, "c");
    else if (strcmp(format, "sam") == 0) strcpy(mode, "");
    else return -1;

    return 0;
}